

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * __thiscall
TiXmlText::Parse(TiXmlText *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  bool bVar1;
  TiXmlDocument *this_00;
  TiXmlCursor *pTVar2;
  char *pcVar3;
  byte local_71;
  char *end;
  bool ignoreWhite;
  TiXmlString local_50;
  TiXmlString dummy;
  char *endTag;
  char *startTag;
  TiXmlDocument *document;
  TiXmlEncoding encoding_local;
  TiXmlParsingData *data_local;
  char *p_local;
  TiXmlText *this_local;
  
  TiXmlString::operator=(&(this->super_TiXmlNode).value,"");
  this_00 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  if (data != (TiXmlParsingData *)0x0) {
    TiXmlParsingData::Stamp(data,p,encoding);
    pTVar2 = TiXmlParsingData::Cursor(data);
    (this->super_TiXmlNode).super_TiXmlBase.location = *pTVar2;
  }
  dummy.rep_ = (Rep *)anon_var_dwarf_10569;
  if (((this->cdata & 1U) == 0) &&
     (bVar1 = TiXmlBase::StringEqual(p,"<![CDATA[",false,encoding), !bVar1)) {
    pcVar3 = TiXmlBase::ReadText(p,&(this->super_TiXmlNode).value,true,"<",false,encoding);
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      return pcVar3 + -1;
    }
    return (char *)0x0;
  }
  this->cdata = true;
  bVar1 = TiXmlBase::StringEqual(p,"<![CDATA[",false,encoding);
  if (bVar1) {
    data_local = (TiXmlParsingData *)(p + 9);
    while( true ) {
      local_71 = 0;
      if ((data_local != (TiXmlParsingData *)0x0) &&
         (local_71 = 0, (char)(data_local->cursor).row != '\0')) {
        bVar1 = TiXmlBase::StringEqual((char *)data_local,"]]>",false,encoding);
        local_71 = bVar1 ^ 0xff;
      }
      if ((local_71 & 1) == 0) break;
      TiXmlString::operator+=(&(this->super_TiXmlNode).value,(char)(data_local->cursor).row);
      data_local = (TiXmlParsingData *)((long)&(data_local->cursor).row + 1);
    }
    TiXmlString::TiXmlString(&local_50);
    this_local = (TiXmlText *)
                 TiXmlBase::ReadText((char *)data_local,&local_50,false,"]]>",false,encoding);
    TiXmlString::~TiXmlString(&local_50);
  }
  else {
    if (this_00 != (TiXmlDocument *)0x0) {
      TiXmlDocument::SetError(this_00,0xe,p,data,encoding);
    }
    this_local = (TiXmlText *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* TiXmlText::Parse( const char* p, TiXmlParsingData* data, TiXmlEncoding encoding )
{
	value = "";
	TiXmlDocument* document = GetDocument();

	if ( data )
	{
		data->Stamp( p, encoding );
		location = data->Cursor();
	}

	const char* const startTag = "<![CDATA[";
	const char* const endTag   = "]]>";

	if ( cdata || StringEqual( p, startTag, false, encoding ) )
	{
		cdata = true;

		if ( !StringEqual( p, startTag, false, encoding ) )
		{
			if ( document )
				document->SetError( TIXML_ERROR_PARSING_CDATA, p, data, encoding );
			return 0;
		}
		p += strlen( startTag );

		// Keep all the white space, ignore the encoding, etc.
		while (	   p && *p
				&& !StringEqual( p, endTag, false, encoding )
			  )
		{
			value += *p;
			++p;
		}

		TIXML_STRING dummy; 
		p = ReadText( p, &dummy, false, endTag, false, encoding );
		return p;
	}
	else
	{
		bool ignoreWhite = true;

		const char* end = "<";
		p = ReadText( p, &value, ignoreWhite, end, false, encoding );
		if ( p && *p )
			return p-1;	// don't truncate the '<'
		return 0;
	}
}